

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateDSTests.cpp
# Opt level: O0

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthStencilBaseCase::setDynamicViewportState
          (DepthStencilBaseCase *this,deUint32 width,deUint32 height)

{
  DeviceInterface *pDVar1;
  VkCommandBuffer_s **ppVVar2;
  undefined4 local_40;
  undefined4 local_3c;
  VkRect2D scissor;
  VkViewport viewport;
  deUint32 height_local;
  deUint32 width_local;
  DepthStencilBaseCase *this_local;
  
  scissor.extent.width = 0;
  scissor.extent.height = 0;
  pDVar1 = this->m_vk;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4d])(pDVar1,*ppVVar2,0,1,&scissor.extent);
  local_40 = 0;
  local_3c = 0;
  pDVar1 = this->m_vk;
  scissor.offset.x = width;
  scissor.offset.y = height;
  ppVVar2 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x4e])(pDVar1,*ppVVar2,0,1,&local_40);
  return;
}

Assistant:

void setDynamicViewportState (const deUint32 width, const deUint32 height)
	{
		vk::VkViewport viewport;
		viewport.x = 0;
		viewport.y = 0;
		viewport.width = static_cast<float>(width);
		viewport.height = static_cast<float>(height);
		viewport.minDepth = 0.0f;
		viewport.maxDepth = 1.0f;

		m_vk.cmdSetViewport(*m_cmdBuffer, 0, 1, &viewport);

		vk::VkRect2D scissor;
		scissor.offset.x = 0;
		scissor.offset.y = 0;
		scissor.extent.width = width;
		scissor.extent.height = height;
		m_vk.cmdSetScissor(*m_cmdBuffer, 0, 1, &scissor);
	}